

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O0

void avro::codec_traits<testgen::_bigrecord_Union__0__>::encode(Encoder *e,_bigrecord_Union__0__ *v)

{
  size_t sVar1;
  _bigrecord_Union__0__ *in_RSI;
  Encoder *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffff78;
  Encoder *in_stack_ffffffffffffff80;
  _bigrecord_Union__0__ *in_stack_ffffffffffffffc0;
  _bigrecord_Union__0__ *in_stack_ffffffffffffffd8;
  
  sVar1 = testgen::_bigrecord_Union__0__::idx(in_RSI);
  (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,sVar1);
  sVar1 = testgen::_bigrecord_Union__0__::idx(in_RSI);
  if (sVar1 == 0) {
    (**(code **)(*(long *)in_RDI + 0x20))();
  }
  else if (sVar1 == 1) {
    testgen::_bigrecord_Union__0__::get_map_abi_cxx11_(in_stack_ffffffffffffffd8);
    encode<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
              (in_RDI,in_stack_ffffffffffffff78);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x2c11a1);
  }
  else if (sVar1 == 2) {
    testgen::_bigrecord_Union__0__::get_float(in_stack_ffffffffffffffc0);
    encode<float>(in_stack_ffffffffffffff80,(float *)in_RDI);
  }
  return;
}

Assistant:

static void encode(Encoder& e, testgen::_bigrecord_Union__0__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            e.encodeNull();
            break;
        case 1:
            avro::encode(e, v.get_map());
            break;
        case 2:
            avro::encode(e, v.get_float());
            break;
        }
    }